

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_bonsai_trie
          (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint32_t capa_bits,uint32_t symb_bits,uint32_t cht_capa_bits)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> cStack_c8;
  
  (this->hasher_).shift_ = 0;
  (this->hasher_).univ_size_.bits_ = 0;
  (this->hasher_).univ_size_.mask_ = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).size_ = 0;
  (this->table_).mask_ = 0;
  (this->table_).width_ = 0;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (&this->aux_cht_);
  *(undefined8 *)
   ((long)&(this->aux_map_).table_.
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_map_).table_.
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->aux_map_).size_ + 4) = 0;
  *(undefined8 *)((long)&(this->aux_map_).max_size_ + 4) = 0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aux_map_).size_ = 0;
  uVar3 = 0x10;
  if (0x10 < capa_bits) {
    uVar3 = (ulong)capa_bits;
  }
  uVar5 = -1L << (uVar3 & 0x3f);
  (this->aux_map_).capa_size_.mask_ = 0;
  this->size_ = 0;
  (this->capa_size_).bits_ = (uint32_t)uVar3;
  uVar2 = (uint32_t)uVar3 + symb_bits;
  (this->capa_size_).mask_ = ~uVar5;
  (this->symb_size_).bits_ = symb_bits;
  (this->symb_size_).mask_ = -1L << ((ulong)symb_bits & 0x3f) ^ 0xffffffffffffffff;
  auVar1 = vcvtusi2sd_avx512f(in_XMM1,uVar5 * -0x5f);
  auVar6._0_8_ = auVar1._0_8_ / 100.0;
  auVar6._8_8_ = auVar1._8_8_;
  uVar4 = vcvttsd2usi_avx512f(auVar6);
  this->max_size_ = uVar4;
  (this->hasher_).shift_ = (uVar2 >> 1) + 1;
  (this->hasher_).univ_size_.bits_ = uVar2;
  (this->hasher_).univ_size_.mask_ = ~(-1L << ((ulong)uVar2 & 0x3f));
  compact_vector::compact_vector((compact_vector *)&cStack_c8,-uVar5,symb_bits + 4);
  compact_vector::operator=(&this->table_,(compact_vector *)&cStack_c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&cStack_c8);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (&cStack_c8,(this->capa_size_).bits_,cht_capa_bits);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::operator=
            (&this->aux_cht_,&cStack_c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&cStack_c8.table_);
  return;
}

Assistant:

compact_bonsai_trie(uint32_t capa_bits, uint32_t symb_bits, uint32_t cht_capa_bits = 0) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{capa_size_.bits() + symb_size_.bits()};
        table_ = compact_vector{capa_size_.size(), symb_size_.bits() + dsp1_bits};
        aux_cht_ = aux_cht_type{capa_size_.bits(), cht_capa_bits};
    }